

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O0

TokenType __thiscall QXmlStreamReader::readNext(QXmlStreamReader *this)

{
  long lVar1;
  bool bVar2;
  QXmlStreamReaderPrivate *this_00;
  QXmlStreamReaderPrivate *in_RDI;
  long in_FS_OFFSET;
  QXmlStreamReaderPrivate *d;
  QXmlStreamReaderPrivate *in_stack_000005b8;
  undefined4 in_stack_ffffffffffffff68;
  int in_stack_ffffffffffffff6c;
  undefined4 in_stack_ffffffffffffff70;
  Error in_stack_ffffffffffffff74;
  QXmlStreamReaderPrivate *in_stack_ffffffffffffff78;
  QXmlStreamReaderPrivate *this_01;
  TokenType local_3c;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = in_RDI;
  this_00 = d_func((QXmlStreamReader *)0x6471d0);
  if (this_00->type == Invalid) {
    if (this_00->error == PrematureEndOfDocumentError) {
      this_00->type = NoToken;
      this_00->atEnd = false;
      this_00->token = -1;
      local_3c = readNext((QXmlStreamReader *)this_00);
      goto LAB_006473a3;
    }
  }
  else {
    if (((*(ushort *)&this_00->field_0x3a8 >> 4 & 1) == 0) &&
       (bVar2 = QXmlStreamReaderPrivate::checkStartDocument(in_RDI), !bVar2)) {
      local_3c = this_00->type;
      goto LAB_006473a3;
    }
    QXmlStreamReaderPrivate::parse(in_stack_000005b8);
    if ((((this_00->atEnd & 1U) == 0) || (this_00->type == EndDocument)) ||
       (this_00->type == Invalid)) {
      if (((this_00->atEnd & 1U) == 0) && (this_00->type == EndDocument)) {
        QXmlStream::tr((char *)this_00,
                       (char *)CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                       in_stack_ffffffffffffff6c);
        QXmlStreamReaderPrivate::raiseWellFormedError
                  ((QXmlStreamReaderPrivate *)
                   CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                   (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
        QString::~QString((QString *)0x64731a);
      }
    }
    else {
      QString::QString((QString *)0x647274);
      QXmlStreamReaderPrivate::raiseError
                (in_stack_ffffffffffffff78,in_stack_ffffffffffffff74,
                 (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QString::~QString((QString *)0x647294);
    }
  }
  QXmlStreamReaderPrivate::checkToken(this_01);
  local_3c = this_00->type;
LAB_006473a3:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_3c;
}

Assistant:

QXmlStreamReader::TokenType QXmlStreamReader::readNext()
{
    Q_D(QXmlStreamReader);
    if (d->type != Invalid) {
        if (!d->hasCheckedStartDocument)
            if (!d->checkStartDocument())
                return d->type; // synthetic StartDocument or error
        d->parse();
        if (d->atEnd && d->type != EndDocument && d->type != Invalid)
            d->raiseError(PrematureEndOfDocumentError);
        else if (!d->atEnd && d->type == EndDocument)
            d->raiseWellFormedError(QXmlStream::tr("Extra content at end of document."));
    } else if (d->error == PrematureEndOfDocumentError) {
        // resume error
        d->type = NoToken;
        d->atEnd = false;
        d->token = -1;
        return readNext();
    }
    d->checkToken();
    return d->type;
}